

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialogs.cpp
# Opt level: O2

void show_plugin_properties_dlg
               (void *hMainWnd,string *config_path,tExtensionStartupInfo *pExtension)

{
  tDialogBoxLFMProc p_Var1;
  char *pcVar2;
  size_t sVar3;
  __shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> _Stack_3f8;
  string local_3e8;
  string error;
  ifstream ifs;
  streambuf local_398 [16];
  byte abStack_388 [488];
  stringstream body;
  ostream local_190 [376];
  
  gExtension = pExtension;
  std::__cxx11::string::_M_assign((string *)&gConfig_path_abi_cxx11_);
  std::ifstream::ifstream((string *)&ifs);
  std::ifstream::open((string *)&ifs,(_Ios_Openmode)config_path);
  if ((abStack_388[*(long *)(_ifs + -0x18)] & 5) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&body);
    std::ostream::operator<<(local_190,local_398);
    std::ifstream::close();
    error._M_dataplus._M_p = (pointer)&error.field_2;
    error._M_string_length = 0;
    error.field_2._M_local_buf[0] = '\0';
    std::__cxx11::stringbuf::str();
    json11::Json::parse((Json *)&_Stack_3f8,&local_3e8,&error,STANDARD);
    std::__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<json11::JsonValue,_(__gnu_cxx::_Lock_policy)2> *)&gJson,&_Stack_3f8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_3f8._M_refcount);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::__cxx11::string::~string((string *)&error);
    std::__cxx11::stringstream::~stringstream((stringstream *)&body);
  }
  pcVar2 = config_dialog;
  p_Var1 = gExtension->DialogBoxLFM;
  sVar3 = strlen(config_dialog);
  (*p_Var1)((intptr_t)pcVar2,sVar3,DlgProc);
  std::ifstream::~ifstream(&ifs);
  return;
}

Assistant:

void show_plugin_properties_dlg(void *hMainWnd, std::string config_path, tExtensionStartupInfo *pExtension)
{
    gExtension = pExtension;
    gConfig_path = config_path;

    std::ifstream ifs;
    ifs.open(config_path, std::ios::binary | std::ofstream::in);
    if (ifs && !ifs.bad()) {
        std::stringstream body;
        body << ifs.rdbuf();
        ifs.close();

        std::string error;
        gJson = json11::Json::parse(body.str(), error);
    }

    gExtension->DialogBoxLFM((intptr_t)config_dialog, strlen(config_dialog), DlgProc);
}